

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

InvokeResult __thiscall
anon_unknown.dwarf_11d9e95::cmForEachFunctionBlocker::invoke
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus,cmMakefile *mf)

{
  cmListFileFunction *pcVar1;
  bool bVar2;
  byte bVar3;
  short sVar4;
  bool bVar5;
  cmListFileFunction *lff;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  cmExecutionStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lff = (cmListFileFunction *)(this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker;
  pcVar1 = (cmListFileFunction *)
           (this->super_cmFunctionBlocker).StartingContext.Name._M_dataplus._M_p;
  bVar3 = 1;
  sVar4 = 0;
  do {
    if (lff == pcVar1) break;
    cmExecutionStatus::cmExecutionStatus(&status,(cmMakefile *)inStatus);
    local_c0._M_engaged = false;
    cmMakefile::ExecuteCommand
              ((cmMakefile *)inStatus,lff,&status,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_c0);
    if (status.ReturnInvoked == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&status.Variables);
      cmExecutionStatus::SetReturnInvoked((cmExecutionStatus *)functions,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
LAB_003bdace:
      bVar5 = false;
      sVar4 = 1;
    }
    else {
      if (status.BreakInvoked != false) goto LAB_003bdace;
      if (status.ContinueInvoked == false) {
        if (status.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged == true) {
          *(ulong *)((long)&functions[1].
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
               (ulong)(uint)status.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_payload._M_value | 0x100000000;
          goto LAB_003bdace;
        }
        bVar2 = cmSystemTools::GetFatalErrorOccurred();
        bVar5 = !bVar2;
        if (bVar2) {
          bVar3 = 0;
        }
        if (bVar2) {
          sVar4 = 1;
        }
      }
      else {
        bVar5 = false;
      }
    }
    cmExecutionStatus::~cmExecutionStatus(&status);
    lff = lff + 1;
  } while (bVar5);
  return (InvokeResult)((ushort)bVar3 | sVar4 << 8);
}

Assistant:

auto cmForEachFunctionBlocker::invoke(
  std::vector<cmListFileFunction> const& functions,
  cmExecutionStatus& inStatus, cmMakefile& mf) -> InvokeResult
{
  InvokeResult result = { true, false };
  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& func : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(func, status);
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      result.Break = true;
      break;
    }
    if (status.GetBreakInvoked()) {
      result.Break = true;
      break;
    }
    if (status.GetContinueInvoked()) {
      break;
    }
    if (status.HasExitCode()) {
      inStatus.SetExitCode(status.GetExitCode());
      result.Break = true;
      break;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      result.Restore = false;
      result.Break = true;
      break;
    }
  }
  return result;
}